

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O1

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::operation_on_pair_of_landscapes<std::minus<double>>
          (Persistence_landscape *__return_storage_ptr__,Persistence_representations *this,
          Persistence_landscape *land1,Persistence_landscape *land2)

{
  ulong uVar1;
  double *pdVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  double dVar5;
  pointer pvVar6;
  long lVar7;
  pointer ppVar8;
  pointer ppVar9;
  pointer ppVar10;
  undefined8 uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  long *plVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  size_t i;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  land;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_88;
  pair<double,_double> local_70;
  Persistence_landscape *local_60;
  Persistence_landscape *local_58;
  ulong local_50;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  local_48;
  
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar12 = ((long)(__return_storage_ptr__->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish >> 3) * -0x5555555555555555;
  __return_storage_ptr__->number_of_functions_for_vectorization = sVar12;
  __return_storage_ptr__->number_of_functions_for_projections_to_reals = sVar12;
  uVar13 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
  lVar20 = (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar21 = lVar20 * -0x5555555555555555;
  if (uVar21 <= uVar13 && uVar13 + lVar20 * 0x5555555555555555 != 0) {
    uVar21 = uVar13;
  }
  local_60 = land1;
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector(&local_48,uVar21,(allocator_type *)&local_88);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::operator=(&__return_storage_ptr__->land,&local_48);
  uVar21 = 0;
  local_58 = __return_storage_ptr__;
  do {
    uVar14 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
    uVar19 = ((long)(local_60->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_60->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar13 = uVar14;
    if (uVar19 < uVar14) {
      uVar13 = uVar19;
    }
    if (uVar21 == uVar13) {
      if (uVar19 < uVar14) {
        while( true ) {
          uVar13 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
          lVar20 = (long)(local_60->land).
                         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_60->land).
                         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar21 = lVar20 * -0x5555555555555555;
          if (uVar21 <= uVar13 && uVar13 + lVar20 * 0x5555555555555555 != 0) {
            uVar21 = uVar13;
          }
          if (uVar19 == uVar21) break;
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          vector(&local_88,
                 (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 (*(long *)this + uVar19 * 0x18));
          lVar20 = *(long *)(*(long *)this + uVar19 * 0x18);
          lVar16 = *(long *)(*(long *)this + 8 + uVar19 * 0x18) - lVar20;
          if (lVar16 != 0) {
            lVar16 = lVar16 >> 4;
            lVar18 = 8;
            do {
              puVar3 = (undefined8 *)(lVar20 + -8 + lVar18);
              uVar11 = puVar3[1];
              puVar4 = (undefined8 *)
                       ((long)local_88.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8);
              *puVar4 = *puVar3;
              puVar4[1] = uVar11;
              lVar18 = lVar18 + 0x10;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          pvVar6 = (__return_storage_ptr__->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar8 = *(pointer *)
                    &pvVar6[uVar19].
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl;
          ppVar9 = *(pointer *)
                    ((long)&pvVar6[uVar19].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 8);
          ppVar10 = *(pointer *)
                     ((long)&pvVar6[uVar19].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl + 0x10);
          *(pointer *)
           &pvVar6[uVar19].
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl = local_88.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&pvVar6[uVar19].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 8) =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&pvVar6[uVar19].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 0x10) =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar8;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar9;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar10;
          if (ppVar8 != (pointer)0x0) {
            operator_delete(ppVar8,(long)ppVar10 - (long)ppVar8);
          }
          uVar19 = uVar19 + 1;
        }
      }
      if ((ulong)(*(long *)(this + 8) - *(long *)this) <
          (ulong)((long)(local_60->land).
                        super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_60->land).
                       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
        uVar21 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
        while( true ) {
          uVar14 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
          pvVar6 = (local_60->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = (long)(local_60->land).
                         super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3;
          uVar13 = lVar20 * -0x5555555555555555;
          if (uVar13 <= uVar14 && uVar14 + lVar20 * 0x5555555555555555 != 0) {
            uVar13 = uVar14;
          }
          if (uVar21 == uVar13) break;
          std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
          vector(&local_88,pvVar6 + uVar21);
          pvVar6 = (local_60->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = *(long *)&pvVar6[uVar21].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl;
          lVar16 = (long)*(pointer *)
                          ((long)&pvVar6[uVar21].
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl + 8) - lVar20;
          if (lVar16 != 0) {
            lVar16 = lVar16 >> 4;
            lVar18 = 8;
            do {
              dVar5 = *(double *)(lVar20 + lVar18);
              *(undefined8 *)
               ((long)local_88.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8) =
                   *(undefined8 *)(lVar20 + -8 + lVar18);
              *(double *)
               ((long)&(local_88.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar18) = 0.0 - dVar5;
              lVar18 = lVar18 + 0x10;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          pvVar6 = (__return_storage_ptr__->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar8 = *(pointer *)
                    &pvVar6[uVar21].
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl;
          ppVar9 = *(pointer *)
                    ((long)&pvVar6[uVar21].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl + 8);
          ppVar10 = *(pointer *)
                     ((long)&pvVar6[uVar21].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl + 0x10);
          *(pointer *)
           &pvVar6[uVar21].
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl = local_88.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&pvVar6[uVar21].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 8) =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&pvVar6[uVar21].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl + 0x10) =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar8;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar9;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar10;
          if (ppVar8 != (pointer)0x0) {
            operator_delete(ppVar8,(long)ppVar10 - (long)ppVar8);
          }
          uVar21 = uVar21 + 1;
        }
      }
      std::
      vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ::~vector(&local_48);
      return __return_storage_ptr__;
    }
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pair<double,_double> *)0x0;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar20 = *(long *)this;
    lVar16 = *(long *)(lVar20 + uVar21 * 0x18);
    local_50 = uVar21;
    if ((ulong)(*(long *)(lVar20 + 8 + uVar21 * 0x18) - lVar16) < 0x11) {
      uVar13 = 0;
      uVar14 = 0;
    }
    else {
      plVar15 = (long *)(lVar20 + uVar21 * 0x18);
      uVar19 = 1;
      uVar14 = 0;
      uVar13 = 0;
      do {
        uVar1 = uVar13 + 1;
        while( true ) {
          uVar17 = uVar19;
          pvVar6 = (local_60->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar20 = *(long *)&pvVar6[uVar21].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl;
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar6[uVar21].
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl + 8) - lVar20 >> 4) <= uVar1) goto LAB_00106934;
          pvVar6 = pvVar6 + uVar21;
          lVar18 = uVar14 * 0x10;
          dVar5 = *(double *)(lVar16 + lVar18);
          lVar16 = uVar13 * 0x10;
          dVar22 = *(double *)(lVar20 + lVar16);
          if (dVar22 <= dVar5) break;
          local_70.first = *(double *)(*plVar15 + lVar18);
          lVar20 = *(long *)&(pvVar6->
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             )._M_impl;
          dVar5 = *(double *)(lVar20 + -0x10 + lVar16);
          dVar22 = *(double *)(lVar20 + -8 + lVar16);
          dVar23 = (*(double *)(lVar20 + 8 + lVar16) - dVar22) /
                   (*(double *)(lVar20 + lVar16) - dVar5);
          local_70.second =
               *(double *)(*plVar15 + 8 + lVar18) -
               (dVar23 * local_70.first + (dVar22 - dVar5 * dVar23));
          if (local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
            _M_realloc_insert<std::pair<double,double>>
                      ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                       &local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            (local_88.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
            (local_88.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
            local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          plVar15 = (long *)(*(long *)this + uVar21 * 0x18);
          lVar16 = *plVar15;
          uVar19 = uVar17 + 1;
          uVar14 = uVar17;
          if ((ulong)(plVar15[1] - lVar16 >> 4) <= uVar17 + 1) goto LAB_00106934;
        }
        if (dVar5 <= dVar22) {
          if ((dVar5 == dVar22) && (!NAN(dVar5) && !NAN(dVar22))) {
            lVar20 = *(long *)&(pvVar6->
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               )._M_impl;
            local_70.second = *(double *)(*plVar15 + 8 + lVar18) - *(double *)(lVar20 + 8 + lVar16);
            local_70.first = *(double *)(lVar20 + lVar16);
            if (local_88.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_88.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_realloc_insert<std::pair<double,double>>
                        ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                          *)&local_88,
                         (iterator)
                         local_88.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_70);
              uVar13 = uVar1;
              uVar14 = uVar17;
            }
            else {
              (local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
              (local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
              local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_88.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              uVar13 = uVar1;
              uVar14 = uVar17;
            }
          }
        }
        else {
          lVar20 = *(long *)&(pvVar6->
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             )._M_impl;
          lVar7 = *plVar15;
          dVar5 = *(double *)(lVar7 + 8 + lVar18);
          local_70.first = *(double *)(lVar20 + lVar16);
          dVar22 = (*(double *)(lVar7 + -8 + lVar18) - dVar5) /
                   (*(double *)(lVar7 + -0x10 + lVar18) - *(double *)(lVar7 + lVar18));
          local_70.second =
               (dVar22 * local_70.first + (dVar5 - *(double *)(lVar7 + lVar18) * dVar22)) -
               *(double *)(lVar20 + 8 + lVar16);
          if (local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_88.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
            _M_realloc_insert<std::pair<double,double>>
                      ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                       &local_88,
                       (iterator)
                       local_88.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
            uVar13 = uVar1;
          }
          else {
            (local_88.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
            (local_88.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
            local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_88.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            uVar13 = uVar1;
          }
        }
        uVar19 = uVar14 + 1;
        plVar15 = (long *)(*(long *)this + uVar21 * 0x18);
        lVar16 = *plVar15;
      } while (uVar19 < (ulong)(plVar15[1] - lVar16 >> 4));
    }
LAB_00106934:
    uVar19 = uVar14 + 1;
    lVar20 = *(long *)this;
    if (uVar19 < (ulong)(*(long *)(lVar20 + 8 + uVar21 * 0x18) - *(long *)(lVar20 + uVar21 * 0x18)
                        >> 4)) {
      plVar15 = (long *)(lVar20 + uVar21 * 0x18);
      uVar14 = uVar14 << 4 | 8;
      do {
        pvVar6 = (local_60->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar13 + 1 <
            (ulong)((long)*(pointer *)
                           ((long)&pvVar6[uVar21].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl + 8) -
                    *(long *)&pvVar6[uVar21].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl >> 4)) break;
        pdVar2 = (double *)(*plVar15 + -8 + uVar14);
        local_70.first = *pdVar2;
        local_70.second = pdVar2[1];
        if (local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
        }
        else {
          (local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
          (local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        plVar15 = (long *)(*(long *)this + uVar21 * 0x18);
        uVar19 = uVar19 + 1;
        uVar14 = uVar14 + 0x10;
      } while (uVar19 < (ulong)(plVar15[1] - *plVar15 >> 4));
    }
    if ((ulong)(*(long *)(*(long *)this + 8 + uVar21 * 0x18) -
                *(long *)(*(long *)this + uVar21 * 0x18) >> 4) <= uVar19) {
      uVar14 = uVar13 << 4 | 8;
      do {
        uVar13 = uVar13 + 1;
        pvVar6 = (local_60->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar6[uVar21].
                                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                   ._M_impl + 8) -
                    *(long *)&pvVar6[uVar21].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl >> 4) <= uVar13) break;
        lVar20 = *(long *)&pvVar6[uVar21].
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl;
        local_70.second = 0.0 - *(double *)(lVar20 + uVar14);
        local_70.first = *(double *)(lVar20 + -8 + uVar14);
        if (local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>
                    ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                     &local_88,
                     (iterator)
                     local_88.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
        }
        else {
          (local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_70.first;
          (local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
          local_88.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_88.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar14 = uVar14 + 0x10;
      } while ((ulong)(*(long *)(*(long *)this + 8 + uVar21 * 0x18) -
                       *(long *)(*(long *)this + uVar21 * 0x18) >> 4) <= uVar19);
    }
    __return_storage_ptr__ = local_58;
    local_70.first = 2147483647.0;
    local_70.second = 0.0;
    if (local_88.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      _M_realloc_insert<std::pair<double,double>>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &local_88,
                 (iterator)
                 local_88.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_70);
    }
    else {
      (local_88.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->first = 2147483647.0;
      (local_88.
       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish)->second = 0.0;
      local_88.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pvVar6 = (__return_storage_ptr__->land).
             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = *(pointer *)
              &pvVar6[uVar21].
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl;
    ppVar9 = *(pointer *)
              ((long)&pvVar6[uVar21].
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl + 8);
    ppVar10 = *(pointer *)
               ((long)&pvVar6[uVar21].
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl + 0x10);
    *(pointer *)
     &pvVar6[uVar21].
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl = local_88.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&pvVar6[uVar21].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl + 8) =
         local_88.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&pvVar6[uVar21].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl + 0x10) =
         local_88.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = ppVar8;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar9;
    local_88.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar10;
    if (ppVar8 != (pointer)0x0) {
      operator_delete(ppVar8,(long)ppVar10 - (long)ppVar8);
    }
    uVar21 = local_50 + 1;
  } while( true );
}

Assistant:

Persistence_landscape operation_on_pair_of_landscapes(const Persistence_landscape& land1,
                                                      const Persistence_landscape& land2) {
  bool operation_on_pair_of_landscapesDBG = false;
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes\n";
    std::cin.ignore();
  }
  Persistence_landscape result;
  std::vector<std::vector<std::pair<double, double> > > land(std::max(land1.land.size(), land2.land.size()));
  result.land = land;
  T oper;

  if (operation_on_pair_of_landscapesDBG) {
    for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
      std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
      std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
    std::vector<std::pair<double, double> > lambda_n;
    size_t p = 0;
    size_t q = 0;
    while ((p + 1 < land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "p : " << p << "\n";
        std::clog << "q : " << q << "\n";
        std::clog << "land1.land.size() : " << land1.land.size() << std::endl;
        std::clog << "land2.land.size() : " << land2.land.size() << std::endl;
        std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
        std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
        std::clog << "land1.land[i][p].first : " << land1.land[i][p].first << "\n";
        std::clog << "land2.land[i][q].first : " << land2.land[i][q].first << "\n";
      }

      if (land1.land[i][p].first < land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "first \n";
          std::clog << " function_value(land2.land[i][q-1],land2.land[i][q],land1.land[i][p].first) : "
                    << function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first) << "\n";
        }
        lambda_n.push_back(
            std::make_pair(land1.land[i][p].first,
                           oper(static_cast<double>(land1.land[i][p].second),
                                function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first))));
        ++p;
        continue;
      }
      if (land1.land[i][p].first > land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "Second \n";
          std::clog << "function_value(" << land1.land[i][p - 1].first << " " << land1.land[i][p - 1].second << " ,"
                    << land1.land[i][p].first << " " << land1.land[i][p].second << ", " << land2.land[i][q].first
                    << " ) : " << function_value(land1.land[i][p - 1], land1.land[i][p - 1], land2.land[i][q].first)
                    << "\n";
          std::clog << "oper( " << function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first) << ","
                    << land2.land[i][q].second << " : "
                    << oper(land2.land[i][q].second,
                            function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first))
                    << "\n";
        }
        lambda_n.push_back(std::make_pair(
            land2.land[i][q].first, oper(function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first),
                                         land2.land[i][q].second)));
        ++q;
        continue;
      }
      if (land1.land[i][p].first == land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) std::clog << "Third \n";
        lambda_n.push_back(
            std::make_pair(land2.land[i][q].first, oper(land1.land[i][p].second, land2.land[i][q].second)));
        ++p;
        ++q;
      }
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "Next iteration \n";
      }
    }
    while ((p + 1 < land1.land[i].size()) && (q + 1 >= land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land1.land[i][p].first
                  << "  oper(land1.land[i][p].second,0) : " << oper(land1.land[i][p].second, 0) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land1.land[i][p].first, oper(land1.land[i][p].second, 0)));
      ++p;
    }
    while ((p + 1 >= land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land2.land[i][q].first
                  << " oper(0,land2.land[i][q].second) : " << oper(0, land2.land[i][q].second) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land2.land[i][q].first, oper(0, land2.land[i][q].second)));
      ++q;
    }
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    // CHANGE
    // result.land[i] = lambda_n;
    result.land[i].swap(lambda_n);
  }
  if (land1.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "land1.land.size() > std::min( land1.land.size() , land2.land.size() )" << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land1.land[i]);
      for (size_t nr = 0; nr != land1.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land1.land[i][nr].first, oper(land1.land[i][nr].second, 0));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (land2.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "( land2.land.size() > std::min( land1.land.size() , land2.land.size() ) ) " << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land2.land[i]);
      for (size_t nr = 0; nr != land2.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land2.land[i][nr].first, oper(0, land2.land[i][nr].second));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes END\n";
    std::cin.ignore();
  }
  return result;
}